

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O2

bool goodform::convert<unsigned_short>(any *v,unsigned_short *dest)

{
  bool bVar1;
  bool bVar2;
  ushort uVar3;
  char *pcVar4;
  unsigned_long *puVar5;
  byte *pbVar6;
  float *pfVar7;
  double *pdVar8;
  
  bVar1 = can_be<unsigned_short>(v);
  if (!bVar1) {
    return bVar1;
  }
  bVar2 = is<signed_char>(v);
  if (bVar2) {
    pcVar4 = std::any_cast<signed_char_const&>(v);
    uVar3 = (ushort)*pcVar4;
    goto LAB_00130ef9;
  }
  bVar2 = is<short>(v);
  if (bVar2) {
    puVar5 = (unsigned_long *)std::any_cast<short_const&>(v);
  }
  else {
    bVar2 = is<int>(v);
    if (bVar2) {
      puVar5 = (unsigned_long *)std::any_cast<int_const&>(v);
    }
    else {
      bVar2 = is<long>(v);
      if (bVar2) {
        puVar5 = (unsigned_long *)std::any_cast<long_const&>(v);
      }
      else {
        bVar2 = is<unsigned_char>(v);
        if (bVar2) {
          pbVar6 = std::any_cast<unsigned_char_const&>(v);
          uVar3 = (ushort)*pbVar6;
          goto LAB_00130ef9;
        }
        bVar2 = is<unsigned_short>(v);
        if (bVar2) {
          puVar5 = (unsigned_long *)std::any_cast<unsigned_short_const&>(v);
        }
        else {
          bVar2 = is<unsigned_int>(v);
          if (bVar2) {
            puVar5 = (unsigned_long *)std::any_cast<unsigned_int_const&>(v);
          }
          else {
            bVar2 = is<unsigned_long>(v);
            if (!bVar2) {
              bVar2 = is<float>(v);
              if (bVar2) {
                pfVar7 = std::any_cast<float_const&>(v);
                uVar3 = (ushort)(int)*pfVar7;
              }
              else {
                bVar2 = is<double>(v);
                if (!bVar2) {
                  return bVar1;
                }
                pdVar8 = std::any_cast<double_const&>(v);
                uVar3 = (ushort)(int)*pdVar8;
              }
              goto LAB_00130ef9;
            }
            puVar5 = std::any_cast<unsigned_long_const&>(v);
          }
        }
      }
    }
  }
  uVar3 = (ushort)*puVar5;
LAB_00130ef9:
  *dest = uVar3;
  return bVar1;
}

Assistant:

bool convert(const any& v, T& dest)
  {
    if (can_be<T>(v))
    {
      if (is<std::int8_t>(v))        dest = T(get<std::int8_t>(v));
      else if (is<std::int16_t>(v))  dest = T(get<std::int16_t>(v));
      else if (is<std::int32_t>(v))  dest = T(get<std::int32_t>(v));
      else if (is<std::int64_t>(v))  dest = T(get<std::int64_t>(v));
      else if (is<std::uint8_t>(v))  dest = T(get<std::uint8_t>(v));
      else if (is<std::uint16_t>(v)) dest = T(get<std::uint16_t>(v));
      else if (is<std::uint32_t>(v)) dest = T(get<std::uint32_t>(v));
      else if (is<std::uint64_t>(v)) dest = T(get<std::uint64_t>(v));
      else if (is<float>(v))         dest = T(get<float>(v));
      else if (is<double>(v))        dest = T(get<double>(v));
      return true;
    }
    return false;
  }